

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int i;
  long lVar4;
  long lVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  double theta_local;
  double delta_local;
  double kappa_local;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar3 = false;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    k = *first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
    ::decrease_preference
              ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    sizes = solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
            ::compute_reduced_costs<baryonyx::bit_array>
                      ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                        *)this,it.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl,
                       (row_iterator)
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                       super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,x);
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
              (*(rc_data **)(this + 0x68),*(rc_data **)(this + 0x68) + sizes.r_size,
               *(random_engine **)(this + 8));
    selected = solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
               ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                   *)this,&sizes,*(int *)(*(long *)(this + 0x70) + (long)k * 0xc),
                                  *(int *)(*(long *)(this + 0x70) + 4 + (long)k * 0xc));
    fmt_00._M_str = "constraints {}: {} <= ";
    fmt_00._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_00,&k,(int *)((long)k * 0xc + *(long *)(this + 0x70)))
    ;
    lVar5 = 0xc;
    for (lVar4 = 0; lVar4 < sizes.r_size; lVar4 = lVar4 + 1) {
      lVar1 = *(long *)(this + 0x68);
      fmt_01._M_str = "{} ({} {}) ";
      fmt_01._M_len = 0xb;
      debug_logger<true>::log<int,double,int>
                ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar5),
                 (double *)(lVar1 + -0xc + lVar5),(int *)(lVar1 + lVar5));
      lVar5 = lVar5 + 0x10;
    }
    fmt_02._M_str = "<= {} => Selected: {}\n";
    fmt_02._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_02,(int *)(*(long *)(this + 0x70) + 4 + (long)k * 0xc)
               ,&selected);
    bVar2 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,sizes.r_size,kappa_local,delta_local);
    bVar3 = (bool)(bVar3 | bVar2);
  }
  return bVar3;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }